

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

QWidget * __thiscall QFormLayout::labelForField(QFormLayout *this,QLayout *field)

{
  long lVar1;
  undefined8 *puVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  ItemRole role;
  int row;
  ItemRole local_20;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  local_1c = -0x55555556;
  local_20 = 0xaaaaaaaa;
  getLayoutPosition(this,field,&local_1c,&local_20);
  if ((((long)local_1c == -1) || (local_20 != FieldRole)) ||
     (puVar2 = *(undefined8 **)(*(long *)(lVar1 + 200) + (long)local_1c * 0x10),
     puVar2 == (undefined8 *)0x0)) {
    pQVar3 = (QWidget *)0x0;
  }
  else {
    pQVar3 = (QWidget *)(**(code **)(*(long *)*puVar2 + 0x68))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QWidget *QFormLayout::labelForField(QLayout *field) const
{
    Q_D(const QFormLayout);

    int row;
    ItemRole role;

    getLayoutPosition(field, &row, &role);

    if (row != -1 && role == FieldRole) {
        if (QFormLayoutItem *label = d->m_matrix(row, LabelRole))
            return label->widget();
    }
    return nullptr;
}